

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actions.hpp
# Opt level: O2

invocation_table<afsm::test::events::ready_for_query> *
afsm::actions::detail::
inner_dispatch_table<std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::connection_fsm_def::connecting,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::connection_fsm_def::authorizing,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::connection_fsm_def::idle,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::connection_fsm_def::terminated,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>
::state_table<afsm::test::events::ready_for_query,0ul,1ul,2ul,3ul,4ul,5ul>
          (indexes_tuple<0UL,_1UL,_2UL,_3UL,_4UL,_5UL> *param_1)

{
  int iVar1;
  
  if ((state_table<afsm::test::events::ready_for_query,0ul,1ul,2ul,3ul,4ul,5ul>(psst::meta::indexes_tuple<0ul,1ul,2ul,3ul,4ul,5ul>const&)
       ::_table == '\0') &&
     (iVar1 = __cxa_guard_acquire(&state_table<afsm::test::events::ready_for_query,0ul,1ul,2ul,3ul,4ul,5ul>(psst::meta::indexes_tuple<0ul,1ul,2ul,3ul,4ul,5ul>const&)
                                   ::_table), iVar1 != 0)) {
    inner_dispatch_table<std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
    ::state_table<afsm::test::events::ready_for_query,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>::_table.
    _M_elems[0].super__Function_base._M_functor = (_Any_data)ZEXT816(0);
    inner_dispatch_table<std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
    ::state_table<afsm::test::events::ready_for_query,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>::_table.
    _M_elems[0]._M_invoker =
         std::
         _Function_handler<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_&,_afsm::test::events::ready_for_query_&&),_afsm::actions::detail::process_event_handler<0UL>_>
         ::_M_invoke;
    inner_dispatch_table<std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
    ::state_table<afsm::test::events::ready_for_query,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>::_table.
    _M_elems[0].super__Function_base._M_manager =
         std::
         _Function_handler<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_&,_afsm::test::events::ready_for_query_&&),_afsm::actions::detail::process_event_handler<0UL>_>
         ::_M_manager;
    inner_dispatch_table<std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
    ::state_table<afsm::test::events::ready_for_query,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>::_table.
    _M_elems[1].super__Function_base._M_functor = (_Any_data)ZEXT816(0);
    inner_dispatch_table<std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
    ::state_table<afsm::test::events::ready_for_query,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>::_table.
    _M_elems[1]._M_invoker =
         std::
         _Function_handler<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_&,_afsm::test::events::ready_for_query_&&),_afsm::actions::detail::process_event_handler<1UL>_>
         ::_M_invoke;
    inner_dispatch_table<std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
    ::state_table<afsm::test::events::ready_for_query,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>::_table.
    _M_elems[1].super__Function_base._M_manager =
         std::
         _Function_handler<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_&,_afsm::test::events::ready_for_query_&&),_afsm::actions::detail::process_event_handler<1UL>_>
         ::_M_manager;
    inner_dispatch_table<std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
    ::state_table<afsm::test::events::ready_for_query,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>::_table.
    _M_elems[2].super__Function_base._M_functor = (_Any_data)ZEXT816(0);
    inner_dispatch_table<std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
    ::state_table<afsm::test::events::ready_for_query,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>::_table.
    _M_elems[2]._M_invoker =
         std::
         _Function_handler<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_&,_afsm::test::events::ready_for_query_&&),_afsm::actions::detail::process_event_handler<2UL>_>
         ::_M_invoke;
    inner_dispatch_table<std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
    ::state_table<afsm::test::events::ready_for_query,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>::_table.
    _M_elems[2].super__Function_base._M_manager =
         std::
         _Function_handler<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_&,_afsm::test::events::ready_for_query_&&),_afsm::actions::detail::process_event_handler<2UL>_>
         ::_M_manager;
    inner_dispatch_table<std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
    ::state_table<afsm::test::events::ready_for_query,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>::_table.
    _M_elems[3].super__Function_base._M_functor = (_Any_data)ZEXT816(0);
    inner_dispatch_table<std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
    ::state_table<afsm::test::events::ready_for_query,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>::_table.
    _M_elems[3]._M_invoker =
         std::
         _Function_handler<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_&,_afsm::test::events::ready_for_query_&&),_afsm::actions::detail::process_event_handler<3UL>_>
         ::_M_invoke;
    inner_dispatch_table<std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
    ::state_table<afsm::test::events::ready_for_query,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>::_table.
    _M_elems[3].super__Function_base._M_manager =
         std::
         _Function_handler<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_&,_afsm::test::events::ready_for_query_&&),_afsm::actions::detail::process_event_handler<3UL>_>
         ::_M_manager;
    inner_dispatch_table<std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
    ::state_table<afsm::test::events::ready_for_query,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>::_table.
    _M_elems[4].super__Function_base._M_functor = (_Any_data)ZEXT816(0);
    inner_dispatch_table<std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
    ::state_table<afsm::test::events::ready_for_query,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>::_table.
    _M_elems[4]._M_invoker =
         std::
         _Function_handler<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_&,_afsm::test::events::ready_for_query_&&),_afsm::actions::detail::process_event_handler<4UL>_>
         ::_M_invoke;
    inner_dispatch_table<std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
    ::state_table<afsm::test::events::ready_for_query,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>::_table.
    _M_elems[4].super__Function_base._M_manager =
         std::
         _Function_handler<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_&,_afsm::test::events::ready_for_query_&&),_afsm::actions::detail::process_event_handler<4UL>_>
         ::_M_manager;
    inner_dispatch_table<std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
    ::state_table<afsm::test::events::ready_for_query,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>::_table.
    _M_elems[5].super__Function_base._M_functor = (_Any_data)ZEXT816(0);
    inner_dispatch_table<std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
    ::state_table<afsm::test::events::ready_for_query,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>::_table.
    _M_elems[5]._M_invoker =
         std::
         _Function_handler<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_&,_afsm::test::events::ready_for_query_&&),_afsm::actions::detail::process_event_handler<5UL>_>
         ::_M_invoke;
    inner_dispatch_table<std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
    ::state_table<afsm::test::events::ready_for_query,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>::_table.
    _M_elems[5].super__Function_base._M_manager =
         std::
         _Function_handler<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_&,_afsm::test::events::ready_for_query_&&),_afsm::actions::detail::process_event_handler<5UL>_>
         ::_M_manager;
    __cxa_atexit(std::
                 array<std::function<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_&,_afsm::test::events::ready_for_query_&&)>,_6UL>
                 ::~array,&inner_dispatch_table<std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
                           ::
                           state_table<afsm::test::events::ready_for_query,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>
                           ::_table,&__dso_handle);
    __cxa_guard_release(&state_table<afsm::test::events::ready_for_query,0ul,1ul,2ul,3ul,4ul,5ul>(psst::meta::indexes_tuple<0ul,1ul,2ul,3ul,4ul,5ul>const&)
                         ::_table);
  }
  return &inner_dispatch_table<std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
          ::state_table<afsm::test::events::ready_for_query,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>::_table;
}

Assistant:

static invocation_table<Event> const&
    state_table( ::psst::meta::indexes_tuple< Indexes... > const& )
    {
        static invocation_table<Event> _table {{ process_event_handler<Indexes>{}... }};
        return _table;
    }